

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorUtil.c
# Opt level: O2

int CountLiteralsCheck(void)

{
  varvalue vVar1;
  Cube *pC;
  uint uVar2;
  uint uVar3;
  char *__assertion;
  int Var;
  
  pC = IterCubeSetStart();
  uVar2 = 0;
  uVar3 = 0;
  while( true ) {
    if (pC == (Cube *)0x0) {
      if (uVar3 != uVar2) {
        printf("Warning! The recorded number of literals (%d) differs from the actual number (%d)\n"
               ,(ulong)uVar3,(ulong)uVar2);
      }
      return uVar2;
    }
    if (pC->fMark != '\0') break;
    uVar3 = uVar3 + (int)pC->a;
    for (Var = 0; Var < g_CoverInfo.nVarsIn; Var = Var + 1) {
      vVar1 = GetVar(pC,Var);
      if (vVar1 != VAR_ABS) {
        if ((vVar1 != VAR_POS) && (vVar1 != VAR_NEG)) {
          __assertion = "0";
          uVar2 = 0x6d;
          goto LAB_002f43c7;
        }
        uVar2 = uVar2 + 1;
      }
    }
    pC = IterCubeSetNext();
  }
  __assertion = "p->fMark == 0";
  uVar2 = 0x61;
LAB_002f43c7:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorUtil.c"
                ,uVar2,"int CountLiteralsCheck()");
}

Assistant:

int CountLiteralsCheck()
{
    Cube* p;
    int Value, v;
    int LitCounter = 0;
    int LitCounterControl = 0;

    for ( p = IterCubeSetStart( ); p; p = IterCubeSetNext() )
    {
        LitCounterControl += p->a;

        assert( p->fMark == 0 );

        // write the input variables
        for ( v = 0; v < g_CoverInfo.nVarsIn; v++ )
        {
            Value = GetVar( p, v );
            if ( Value == VAR_NEG )
                LitCounter++;
            else if ( Value == VAR_POS )
                LitCounter++;
            else if ( Value != VAR_ABS )
            {
                assert(0);
            }
        }
    }

    if ( LitCounterControl != LitCounter )
        printf( "Warning! The recorded number of literals (%d) differs from the actual number (%d)\n", LitCounterControl, LitCounter );
    return LitCounter;
}